

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  
  field = this->descriptor_;
  if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,field);
    io::Printer::Print(printer,&this->variables_,"$deprecation$boolean has$capitalized_name$();\n");
    field = this->descriptor_;
    if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) goto LAB_002b7ffe;
  }
  WriteFieldDocComment(printer,field);
  io::Printer::Print(printer,&this->variables_,"$deprecation$int get$capitalized_name$Value();\n");
  field = this->descriptor_;
LAB_002b7ffe:
  WriteFieldDocComment(printer,field);
  io::Printer::Print(printer,&this->variables_,"$deprecation$$type$ get$capitalized_name$();\n");
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::
GenerateInterfaceMembers(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$boolean has$capitalized_name$();\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$int get$capitalized_name$Value();\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$$type$ get$capitalized_name$();\n");
}